

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::InvalidateSubFboRenderCase::render
          (InvalidateSubFboRenderCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  int i;
  ChannelOrder CVar2;
  int iVar3;
  int iVar4;
  deUint32 program;
  int iVar5;
  int iVar6;
  long lVar8;
  Context *pCVar9;
  int i_3;
  deUint32 *attachments_00;
  deUint32 depthStencilRbo;
  deUint32 colorRbo;
  Vector<float,_4> res_1;
  Vector<float,_4> res_2;
  deUint32 fbo;
  int local_224;
  int local_220;
  uint local_21c;
  float local_218 [2];
  undefined1 *puStack_210;
  Vec4 cScale;
  TextureFormat colorFmt;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  TextureFormatInfo colorFmtInfo;
  FlatColorShader flatShader;
  TextureFormat TVar7;
  
  colorFmt = glu::mapGLInternalFormat(this->m_colorFmt);
  if (this->m_depthStencilFmt == 0) {
    CVar2 = CHANNELORDER_LAST;
  }
  else {
    TVar7 = glu::mapGLInternalFormat(this->m_depthStencilFmt);
    CVar2 = TVar7.order;
  }
  tcu::getTextureFormatInfo(&colorFmtInfo,&colorFmt);
  local_21c = CVar2 - S;
  cScale.m_data[0] = 0.0;
  cScale.m_data[1] = 0.0;
  cScale.m_data[2] = 0.0;
  cScale.m_data[3] = 0.0;
  lVar8 = 0;
  do {
    cScale.m_data[lVar8] = colorFmtInfo.valueMax.m_data[lVar8] - colorFmtInfo.valueMin.m_data[lVar8]
    ;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  fbo = 0;
  colorRbo = 0;
  depthStencilRbo = 0;
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  iVar6 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar6 = iVar3;
  }
  iVar4 = sglr::ContextWrapper::getHeight(this_00);
  iVar3 = iVar4 + 3;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  local_220 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getHeight(this_00);
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  getFBODiscardAttachments(&attachments,this->m_invalidateBuffers);
  local_224 = iVar4;
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar9->_vptr_Context[0x75])(pCVar9,&flatShader);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&colorRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,colorRbo);
  dVar1 = this->m_colorFmt;
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,dVar1,iVar4,iVar5);
  if (this->m_depthStencilFmt != 0) {
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&depthStencilRbo);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,depthStencilRbo);
    dVar1 = this->m_depthStencilFmt;
    iVar4 = sglr::ContextWrapper::getWidth(this_00);
    iVar5 = sglr::ContextWrapper::getHeight(this_00);
    sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,dVar1,iVar4,iVar5);
  }
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,colorRbo);
  if ((CVar2 == DS) || (CVar2 == D)) {
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,depthStencilRbo);
  }
  if (local_21c < 2) {
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d20,0x8d41,depthStencilRbo);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  iVar4 = local_220 / 2;
  iVar5 = local_224 / 2;
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  puStack_210 = (undefined1 *)0x3f80000000000000;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar8 = 0;
  do {
    res_1.m_data[lVar8] = local_218[lVar8] * cScale.m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar8 = 0;
  do {
    res_2.m_data[lVar8] = res_1.m_data[lVar8] + colorFmtInfo.valueMin.m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  sglr::ContextWrapper::glClearBufferfv(this_00,0x1800,0,res_2.m_data);
  sglr::ContextWrapper::glClearBufferfi(this_00,0x84f9,0,1.0,0);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_218[0] = 1.0;
  local_218[1] = 0.0;
  puStack_210 = (undefined1 *)0x3f80000000000000;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar8 = 0;
  do {
    res_1.m_data[lVar8] = local_218[lVar8] * cScale.m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar8 = 0;
  do {
    res_2.m_data[lVar8] = res_1.m_data[lVar8] + colorFmtInfo.valueMin.m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar9,program,&res_2);
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  res_2.m_data[0] = -1.0;
  res_2.m_data[1] = -1.0;
  res_2.m_data[2] = -1.0;
  res_1.m_data._0_8_ = &DAT_3f8000003f800000;
  res_1.m_data[2] = 1.0;
  sglr::drawQuad(pCVar9,program,(Vec3 *)&res_2,(Vec3 *)&res_1);
  attachments_00 = (deUint32 *)0x0;
  if ((long)attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    attachments_00 =
         attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (this_00,0x8d40,
             (int)((ulong)((long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)attachments.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2),attachments_00,
             iVar6 >> 2,iVar3 >> 2,iVar4,iVar5);
  sglr::ContextWrapper::glScissor(this_00,iVar6 >> 2,iVar3 >> 2,iVar4,iVar5);
  sglr::ContextWrapper::glEnable(this_00,0xc11);
  if ((this->m_invalidateBuffers & 0x4000) != 0) {
    local_218[0] = 0.0;
    local_218[1] = 1.0;
    puStack_210 = (undefined1 *)0x3f80000000000000;
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    res_1.m_data[2] = 0.0;
    res_1.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      res_1.m_data[lVar8] = local_218[lVar8] * cScale.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    res_2.m_data[3] = 0.0;
    lVar8 = 0;
    do {
      res_2.m_data[lVar8] = res_1.m_data[lVar8] + colorFmtInfo.valueMin.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    sglr::ContextWrapper::glClearBufferfv(this_00,0x1800,0,res_2.m_data);
  }
  sglr::ContextWrapper::glClear(this_00,this->m_invalidateBuffers & 0xffffbfff);
  sglr::ContextWrapper::glDisable(this_00,0xc11);
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  puStack_210 = &DAT_3f8000003f800000;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar8 = 0;
  do {
    res_1.m_data[lVar8] = local_218[lVar8] * cScale.m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar8 = 0;
  do {
    res_2.m_data[lVar8] = res_1.m_data[lVar8] + colorFmtInfo.valueMin.m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar9,program,&res_2);
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  res_2.m_data[0] = -1.0;
  res_2.m_data[1] = -1.0;
  res_2.m_data._8_8_ = res_2.m_data._8_8_ & 0xffffffff00000000;
  res_1.m_data._0_8_ = &DAT_3f8000003f800000;
  res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
  sglr::drawQuad(pCVar9,program,(Vec3 *)&res_2,(Vec3 *)&res_1);
  iVar6 = sglr::ContextWrapper::getWidth(this_00);
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,iVar6,iVar3,&colorFmt,&colorFmtInfo.lookupScale,
             &colorFmtInfo.lookupBias);
  if (attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFmt);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		const tcu::Vec4&		cBias					= colorFmtInfo.valueMin;
		tcu::Vec4				cScale					= colorFmtInfo.valueMax-colorFmtInfo.valueMin;
		deUint32				fbo						= 0;
		deUint32				colorRbo				= 0;
		deUint32				depthStencilRbo			= 0;
		int						invalidateX				= getWidth()	/ 4;
		int						invalidateY				= getHeight()	/ 4;
		int						invalidateW				= getWidth()	/ 2;
		int						invalidateH				= getHeight()	/ 2;
		FlatColorShader			flatShader				(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				flatShaderID			= getCurrentContext()->createProgram(&flatShader);

		// Create fbo.
		glGenRenderbuffers		(1, &colorRbo);
		glBindRenderbuffer		(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage	(GL_RENDERBUFFER, m_colorFmt, getWidth(), getHeight());

		if (m_depthStencilFmt != GL_NONE)
		{
			glGenRenderbuffers		(1, &depthStencilRbo);
			glBindRenderbuffer		(GL_RENDERBUFFER, depthStencilRbo);
			glRenderbufferStorage	(GL_RENDERBUFFER, m_depthStencilFmt, getWidth(), getHeight());
		}

		glGenFramebuffers			(1, &fbo);
		glBindFramebuffer			(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);

		if (depth)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		if (stencil)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClearBufferfv	(GL_COLOR, 0, (Vec4(0.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias).getPtr());
		glClearBufferfi	(GL_DEPTH_STENCIL, 0, 1.0f, 0);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), attachments.empty() ? DE_NULL : &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		// Clear invalidated buffers.
		glScissor	(invalidateX, invalidateY, invalidateW, invalidateH);
		glEnable	(GL_SCISSOR_TEST);

		if (m_invalidateBuffers & GL_COLOR_BUFFER_BIT)
			glClearBufferfv(GL_COLOR, 0, (Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias).getPtr());

		glClear		(m_invalidateBuffers & ~GL_COLOR_BUFFER_BIT);
		glDisable	(GL_SCISSOR_TEST);

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight(), colorFmt, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
	}